

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void kratos::MergeIfVisitor::get_targeted_if
               (StmtBlock *block,
               map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
               *result)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer ppVar4;
  pointer ppVar5;
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
  *this_00;
  pointer psVar6;
  pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_> local_88;
  key_type local_68;
  Var *target_var;
  shared_ptr<kratos::Expr> expr;
  pointer ppStack_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::IfStmt> if_;
  
  psVar2 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = ppStack_48;
  for (psVar6 = (block->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    ppStack_48 = ppVar5;
    if (((psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ == If
       ) {
      Stmt::as<kratos::IfStmt>((Stmt *)local_40);
      peVar3 = (((shared_ptr<kratos::Var> *)((long)local_40 + 0xc0))->
               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this = (((shared_ptr<kratos::Var> *)((long)local_40 + 0xc0))->
             super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (peVar3->type_ == Expression) {
        Var::as<kratos::Expr>((Var *)&target_var);
        if (((target_var[1].super_IRNode._vptr_IRNode == (_func_int **)0x19) &&
            (ppVar4 = target_var[1].super_IRNode.fn_name_ln.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish, ppVar4 != (pointer)0x0)) &&
           (*(int *)&ppVar4[9].first._M_dataplus._M_p == 3)) {
          local_68 = (key_type)
                     target_var[1].super_IRNode.fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          this_00 = (vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
                     *)std::
                       map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                       ::operator[](result,&local_68);
          Var::as<kratos::Const>
                    ((Var *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
          local_88.first.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_40;
          local_88.first.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          local_88.second.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ppStack_48 = (pointer)0x0;
          local_88.second.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar5;
          std::
          vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
          ::emplace_back<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>
                    (this_00,&local_88);
          if ((pointer)local_88.second.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.second.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((element_type *)
              local_88.first.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.first.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    ppVar5 = ppStack_48;
  }
  return;
}

Assistant:

void static get_targeted_if(StmtBlock* block, std::map<Var*, std::vector<IfStmtType>>& result) {
        for (auto const& stmt : *block) {
            if (stmt->type() == StatementType::If) {
                auto if_ = stmt->as<IfStmt>();
                auto predicate = if_->predicate();
                if (predicate->type() == VarType::Expression) {
                    auto expr = predicate->as<Expr>();
                    if (expr->op == ExprOp::Eq && expr->right &&
                        expr->right->type() == VarType::ConstValue) {
                        // this is what we want
                        auto* target_var = expr->left;
                        result[target_var].emplace_back(
                            std::make_pair(if_, expr->right->as<Const>()));
                    }
                }
            }
        }
    }